

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void WriteCompactSize<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
               (ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *os,uint64_t nSize)

{
  size_t in_RCX;
  undefined1 *__buf;
  int __fd;
  VectorWriter *this;
  long in_FS_OFFSET;
  uint64_t local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = (int)&local_28;
  if (nSize < 0xfd) {
    local_28 = CONCAT71(local_28._1_7_,(char)nSize);
    this = os->m_substream;
    __buf = (undefined1 *)0x1;
  }
  else if (nSize < 0x10000) {
    local_28 = CONCAT71(local_28._1_7_,0xfd);
    VectorWriter::write(os->m_substream,__fd,(void *)0x1,in_RCX);
    local_28 = CONCAT62(local_28._2_6_,(short)nSize);
    this = os->m_substream;
    __buf = (undefined1 *)0x2;
  }
  else if (nSize >> 0x20 == 0) {
    local_28 = CONCAT71(local_28._1_7_,0xfe);
    VectorWriter::write(os->m_substream,__fd,(void *)0x1,in_RCX);
    local_28 = CONCAT44(local_28._4_4_,(int)nSize);
    this = os->m_substream;
    __buf = (undefined1 *)0x4;
  }
  else {
    local_28 = CONCAT71(local_28._1_7_,0xff);
    VectorWriter::write(os->m_substream,__fd,(void *)0x1,in_RCX);
    this = os->m_substream;
    __buf = &DAT_00000008;
    local_28 = nSize;
  }
  VectorWriter::write(this,__fd,__buf,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}